

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

string * Path::join(string *__return_storage_ptr__,string *base,string *path)

{
  bool bVar1;
  size_t sVar2;
  string *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  _Alloc_hider local_20;
  
  psVar3 = path;
  if (((base->_M_string_length == 0) || (psVar3 = base, path->_M_string_length == 0)) ||
     (bVar1 = is_abspath(path), psVar3 = path, bVar1)) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar3);
  }
  else {
    sVar2 = find_last_slash(base);
    local_20._M_p = "/";
    if (sVar2 == base->_M_string_length - 1) {
      local_20._M_p = "";
    }
    Util::join<std::__cxx11::string_const&,char_const*,std::__cxx11::string_const&>
              (__return_storage_ptr__,(Util *)base,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_20,
               (char **)path,in_R8);
  }
  return __return_storage_ptr__;
}

Assistant:

string join(const string &base, const string &path)
{
	if (base.empty())
		return path;
	if (path.empty())
		return base;

	if (is_abspath(path))
		return path;

	auto index = find_last_slash(base);
	bool need_slash = index != base.size() - 1;
	return Util::join(base, need_slash ? "/" : "", path);
}